

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utImporter.cpp
# Opt level: O0

void __thiscall
ImporterTest_testMemoryRead_Test::~ImporterTest_testMemoryRead_Test
          (ImporterTest_testMemoryRead_Test *this)

{
  ImporterTest_testMemoryRead_Test *this_local;
  
  ~ImporterTest_testMemoryRead_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(ImporterTest, testMemoryRead)
{
    const aiScene* sc = pImp->ReadFileFromMemory(InputData_abRawBlock,InputData_BLOCK_SIZE,
        aiProcessPreset_TargetRealtime_Quality,"3ds");

    ASSERT_TRUE(sc != NULL);
    EXPECT_EQ(aiString("<3DSRoot>"), sc->mRootNode->mName);
    EXPECT_EQ(1U, sc->mNumMeshes);
    EXPECT_EQ(24U, sc->mMeshes[0]->mNumVertices);
    EXPECT_EQ(12U, sc->mMeshes[0]->mNumFaces);
}